

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ButtonEx(char *label,ImVec2 *size_arg,ImGuiButtonFlags flags)

{
  ImVec2 p_max;
  ImVec2 p_min;
  bool bVar1;
  byte bVar2;
  float fVar3;
  ImU32 IVar4;
  ImGuiWindow *pIVar5;
  uint in_EDX;
  undefined8 *in_RSI;
  ImRect *in_RDI;
  float fVar6;
  ImVec2 IVar7;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImVec2 size;
  ImVec2 pos;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff60;
  ImVec2 in_stack_ffffffffffffff68;
  ImGuiWindow *in_stack_ffffffffffffff70;
  ImRect *in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  ImVec2 in_stack_ffffffffffffff90;
  ImVec2 text;
  ImVec2 in_stack_ffffffffffffff98;
  ImVec2 *pos_min;
  float rounding;
  float fVar8;
  float fill_col;
  float fVar9;
  float fVar10;
  ImGuiStyle *pIVar11;
  ImGuiID id_00;
  ImGuiContext *bb_00;
  bool local_1;
  
  pIVar5 = GetCurrentWindow();
  if ((pIVar5->SkipItems & 1U) == 0) {
    pIVar11 = &GImGui->Style;
    bb_00 = GImGui;
    fVar3 = (float)ImGuiWindow::GetID(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                                      in_stack_ffffffffffffff60);
    IVar7 = CalcTextSize((char *)in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68.y._3_1_,in_stack_ffffffffffffff68.x);
    fVar9 = IVar7.x;
    fVar10 = IVar7.y;
    IVar7 = (pIVar5->DC).CursorPos;
    fill_col = IVar7.x;
    fVar6 = IVar7.y;
    if (((in_EDX & 0x8000) != 0) &&
       ((pIVar11->FramePadding).y < (pIVar5->DC).CurrLineTextBaseOffset)) {
      fVar6 = ((pIVar5->DC).CurrLineTextBaseOffset - (pIVar11->FramePadding).y) + fVar6;
    }
    pos_min = (ImVec2 *)*in_RSI;
    IVar7 = CalcItemSize(in_stack_ffffffffffffff68,(float)((ulong)in_stack_ffffffffffffff60 >> 0x20)
                         ,SUB84(in_stack_ffffffffffffff60,0));
    id_00 = (ImGuiID)((ulong)pIVar11 >> 0x20);
    rounding = IVar7.x;
    fVar8 = IVar7.y;
    IVar7 = ::operator+(in_stack_ffffffffffffff48,(ImVec2 *)0x4e37a6);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff90,(ImVec2 *)&stack0xffffffffffffffb4,
                   (ImVec2 *)&stack0xffffffffffffff88);
    ItemSize((ImVec2 *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68.y);
    bVar1 = ItemAdd(in_stack_ffffffffffffff78,(ImGuiID)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                    (ImRect *)in_stack_ffffffffffffff68,
                    (ImGuiItemFlags)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    if (bVar1) {
      bVar2 = ButtonBehavior((ImRect *)bb_00,id_00,(bool *)CONCAT44(fVar3,fVar10),
                             (bool *)CONCAT44(fVar9,fVar6),(ImGuiButtonFlags)fill_col);
      IVar4 = GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                          SUB84(in_stack_ffffffffffffff60,0));
      RenderNavHighlight(in_RDI,(ImGuiID)((ulong)in_RSI >> 0x20),(ImGuiNavHighlightFlags)in_RSI);
      p_min.y = fVar3;
      p_min.x = fVar10;
      p_max.y = fVar9;
      p_max.x = fVar6;
      text = in_stack_ffffffffffffff90;
      RenderFrame(p_min,p_max,(ImU32)fill_col,SUB41((uint)fVar8 >> 0x18,0),rounding);
      if ((bb_00->LogEnabled & 1U) != 0) {
        LogSetNextTextDecoration("[","]");
      }
      ::operator+(in_stack_ffffffffffffff48,(ImVec2 *)0x4e3919);
      ::operator-(in_stack_ffffffffffffff48,(ImVec2 *)0x4e3935);
      RenderTextClipped(pos_min,(ImVec2 *)in_stack_ffffffffffffff98,(char *)text,(char *)IVar7,
                        (ImVec2 *)
                        CONCAT17(in_stack_ffffffffffffff87,
                                 CONCAT16(in_stack_ffffffffffffff86,
                                          CONCAT15(bVar2,CONCAT14(in_stack_ffffffffffffff84,IVar4)))
                                ),(ImVec2 *)in_stack_ffffffffffffff90,
                        (ImRect *)CONCAT44(fill_col,fVar8));
      local_1 = (bool)(bVar2 & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ButtonEx(const char* label, const ImVec2& size_arg, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    ImVec2 pos = window->DC.CursorPos;
    if ((flags & ImGuiButtonFlags_AlignTextBaseLine) && style.FramePadding.y < window->DC.CurrLineTextBaseOffset) // Try to vertically align buttons that are smaller/have no padding so that text baseline matches (bit hacky, since it shouldn't be a flag)
        pos.y += window->DC.CurrLineTextBaseOffset - style.FramePadding.y;
    ImVec2 size = CalcItemSize(size_arg, label_size.x + style.FramePadding.x * 2.0f, label_size.y + style.FramePadding.y * 2.0f);

    const ImRect bb(pos, pos + size);
    ItemSize(size, style.FramePadding.y);
    if (!ItemAdd(bb, id))
        return false;

    if (g.LastItemData.InFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, style.FrameRounding);

    if (g.LogEnabled)
        LogSetNextTextDecoration("[", "]");
    RenderTextClipped(bb.Min + style.FramePadding, bb.Max - style.FramePadding, label, NULL, &label_size, style.ButtonTextAlign, &bb);

    // Automatically close popups
    //if (pressed && !(flags & ImGuiButtonFlags_DontClosePopups) && (window->Flags & ImGuiWindowFlags_Popup))
    //    CloseCurrentPopup();

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    return pressed;
}